

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::StepSizes(IPM *this,Step *step,bool isCentring)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  byte in_DL;
  long in_RSI;
  undefined8 *in_RDI;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double buffer_3;
  double buffer_2;
  double buffer_1;
  double buffer;
  Int blockd;
  Int blockp;
  double alphad;
  double alphap;
  Int j;
  Int num_finite;
  double mufull;
  double maxd;
  double maxp;
  double step_zu;
  double step_zl;
  double step_xu;
  double step_xl;
  Int block_zu;
  Int block_zl;
  Int block_xu;
  Int block_xl;
  double gammaa;
  double gammaf;
  Vector *dzu;
  Vector *dzl;
  Vector *dxu;
  Vector *dxl;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Int n;
  Int m;
  Model *model;
  undefined8 in_stack_fffffffffffffde8;
  Int j_00;
  Iterate *in_stack_fffffffffffffdf0;
  double in_stack_fffffffffffffe18;
  Int *in_stack_fffffffffffffe20;
  Vector *in_stack_fffffffffffffe28;
  double dVar9;
  Vector *in_stack_fffffffffffffe30;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  int local_e0;
  int local_dc;
  double local_d8;
  double local_d0;
  int local_c8;
  int local_c4;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  undefined8 local_70;
  valarray<double> *local_68;
  valarray<double> *local_60;
  valarray<double> *local_58;
  valarray<double> *local_50;
  Vector *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  Int local_28;
  Int local_24;
  Model *local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_20 = Iterate::model((Iterate *)in_RDI[2]);
  local_24 = Model::rows(local_20);
  local_28 = Model::cols(local_20);
  local_30 = Iterate::xl((Iterate *)in_RDI[2]);
  local_38 = Iterate::xu((Iterate *)in_RDI[2]);
  local_40 = Iterate::zl((Iterate *)in_RDI[2]);
  local_48 = Iterate::zu((Iterate *)in_RDI[2]);
  local_50 = (valarray<double> *)(local_10 + 0x10);
  local_58 = (valarray<double> *)(local_10 + 0x20);
  local_60 = (valarray<double> *)(local_10 + 0x40);
  local_68 = (valarray<double> *)(local_10 + 0x50);
  local_70 = 0x3feccccccccccccd;
  local_78 = 0x4024000000000001;
  local_90 = StepToBoundary(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_98 = StepToBoundary(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_a0 = StepToBoundary(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_a8 = StepToBoundary(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  uVar7 = SUB84(local_98,0);
  uVar8 = (int)((ulong)local_98 >> 0x20);
  if (local_90 <= local_98) {
    uVar7 = SUB84(local_90,0);
    uVar8 = (int)((ulong)local_90 >> 0x20);
  }
  local_b0 = (double)(~-(ulong)NAN(local_90) & CONCAT44(uVar8,uVar7) |
                     -(ulong)NAN(local_90) & (ulong)local_98);
  uVar7 = SUB84(local_a8,0);
  uVar8 = (int)((ulong)local_a8 >> 0x20);
  if (local_a0 <= local_a8) {
    uVar7 = SUB84(local_a0,0);
    uVar8 = (int)((ulong)local_a0 >> 0x20);
  }
  local_b8 = (double)(~-(ulong)NAN(local_a0) & CONCAT44(uVar8,uVar7) |
                     -(ulong)NAN(local_a0) & (ulong)local_a8);
  local_c0 = 0.0;
  local_c4 = 0;
  for (local_c8 = 0; local_c8 < local_28 + local_24; local_c8 = local_c8 + 1) {
    j_00 = (Int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    bVar3 = Iterate::has_barrier_lb(in_stack_fffffffffffffdf0,j_00);
    if (bVar3) {
      pdVar4 = std::valarray<double>::operator[](local_30,(long)local_c8);
      dVar2 = local_b0;
      dVar5 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_50,(long)local_c8);
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_40,(long)local_c8);
      dVar1 = local_b8;
      dVar9 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_60,(long)local_c8);
      local_c0 = (dVar2 * dVar6 + dVar5) * (dVar1 * *pdVar4 + dVar9) + local_c0;
      local_c4 = local_c4 + 1;
    }
    bVar3 = Iterate::has_barrier_ub(in_stack_fffffffffffffdf0,j_00);
    if (bVar3) {
      pdVar4 = std::valarray<double>::operator[](local_38,(long)local_c8);
      dVar2 = local_b0;
      dVar5 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_58,(long)local_c8);
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_48,(long)local_c8);
      dVar1 = local_b8;
      dVar9 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_68,(long)local_c8);
      local_c0 = (dVar2 * dVar6 + dVar5) * (dVar1 * *pdVar4 + dVar9) + local_c0;
      local_c4 = local_c4 + 1;
    }
  }
  dVar5 = (local_c0 / (double)local_c4) / 10.000000000000002;
  local_d0 = 1.0;
  local_d8 = 1.0;
  local_dc = -1;
  local_e0 = -1;
  local_c0 = dVar5;
  if (local_b0 < 1.0) {
    if (local_98 < local_90) {
      local_dc = local_80;
      pdVar4 = std::valarray<double>::operator[](local_48,(long)local_80);
      dVar9 = local_b8;
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_68,(long)local_dc);
      local_f0 = dVar5 / (dVar9 * *pdVar4 + dVar6);
      pdVar4 = std::valarray<double>::operator[](local_38,(long)local_dc);
      dVar5 = *pdVar4 - local_f0;
      pdVar4 = std::valarray<double>::operator[](local_58,(long)local_dc);
      local_d0 = dVar5 / -*pdVar4;
    }
    else {
      local_dc = local_7c;
      pdVar4 = std::valarray<double>::operator[](local_40,(long)local_7c);
      dVar9 = local_b8;
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_60,(long)local_dc);
      local_e8 = dVar5 / (dVar9 * *pdVar4 + dVar6);
      pdVar4 = std::valarray<double>::operator[](local_30,(long)local_dc);
      dVar5 = *pdVar4 - local_e8;
      pdVar4 = std::valarray<double>::operator[](local_50,(long)local_dc);
      local_d0 = dVar5 / -*pdVar4;
    }
    local_f8 = local_b0 * 0.9;
    pdVar4 = std::max<double>(&local_d0,&local_f8);
    local_d0 = *pdVar4;
    local_100 = 1.0;
    pdVar4 = std::min<double>(&local_d0,&local_100);
    local_d0 = *pdVar4;
  }
  dVar5 = local_c0;
  if (local_b8 < 1.0) {
    if (local_a8 < local_a0) {
      local_e0 = local_88;
      pdVar4 = std::valarray<double>::operator[](local_38,(long)local_88);
      dVar9 = local_b0;
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](local_58,(long)local_e0);
      local_110 = dVar5 / (dVar9 * *pdVar4 + dVar6);
      pdVar4 = std::valarray<double>::operator[](local_48,(long)local_e0);
      dVar5 = *pdVar4 - local_110;
      pdVar4 = std::valarray<double>::operator[](local_68,(long)local_e0);
      local_d8 = dVar5 / -*pdVar4;
    }
    else {
      local_e0 = local_84;
      dVar9 = local_c0;
      pdVar4 = std::valarray<double>::operator[](local_30,(long)local_84);
      dVar5 = *pdVar4;
      dVar6 = local_b0;
      pdVar4 = std::valarray<double>::operator[](local_50,(long)local_e0);
      local_108 = dVar9 / (dVar6 * *pdVar4 + dVar5);
      pdVar4 = std::valarray<double>::operator[](local_40,(long)local_e0);
      dVar5 = *pdVar4 - local_108;
      pdVar4 = std::valarray<double>::operator[](local_60,(long)local_e0);
      local_d8 = dVar5 / -*pdVar4;
    }
    local_118 = local_b8 * 0.9;
    pdVar4 = std::max<double>(&local_d8,&local_118);
    local_d8 = *pdVar4;
    local_120 = 1.0;
    pdVar4 = std::min<double>(&local_d8,&local_120);
    local_d8 = *pdVar4;
  }
  local_128 = 0.999999;
  pdVar4 = std::min<double>(&local_d0,&local_128);
  in_RDI[4] = *pdVar4;
  local_130 = 0.999999;
  pdVar4 = std::min<double>(&local_d8,&local_130);
  dVar5 = local_d0;
  in_RDI[5] = *pdVar4;
  if ((local_11 & 1) != 0) {
    dVar6 = Control::centringAlphaScaling((Control *)*in_RDI);
    in_RDI[4] = dVar5 * dVar6;
    dVar5 = Control::centringAlphaScaling((Control *)*in_RDI);
    in_RDI[5] = local_d8 * dVar5;
  }
  return;
}

Assistant:

void IPM::StepSizes(const Step& step, bool isCentring) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double gammaf = 0.9;
    const double gammaa = 1.0 / (1.0-gammaf);

    Int block_xl, block_xu, block_zl, block_zu;
    double step_xl = StepToBoundary(xl, dxl, &block_xl);
    double step_xu = StepToBoundary(xu, dxu, &block_xu);
    double step_zl = StepToBoundary(zl, dzl, &block_zl);
    double step_zu = StepToBoundary(zu, dzu, &block_zu);
    double maxp = std::fmin(step_xl, step_xu);
    double maxd = std::fmin(step_zl, step_zu);
    double mufull = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            mufull += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            mufull += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(mufull));
    mufull /= num_finite;
    mufull /= gammaa;

    double alphap = 1.0;
    double alphad = 1.0;
    Int blockp = -1;
    Int blockd = -1;
    if (maxp < 1.0) {
        if (step_xl <= step_xu) {
            double buffer;
            blockp = block_xl;
            buffer = mufull / (zl[blockp] + maxd*dzl[blockp]);
            alphap = (xl[blockp]-buffer) / (-dxl[blockp]);
        } else {
            double buffer;
            blockp = block_xu;
            buffer = mufull / (zu[blockp] + maxd*dzu[blockp]);
            alphap = (xu[blockp]-buffer) / (-dxu[blockp]);
        }
        alphap = std::max(alphap, gammaf*maxp);
        alphap = std::min(alphap, 1.0);
        assert(blockp >= 0.0);
    }
    if (maxd < 1.0) {
        if (step_zl <= step_zu) {
            double buffer;
            blockd = block_zl;
            buffer = mufull / (xl[blockd] + maxp*dxl[blockd]);
            alphad = (zl[blockd]-buffer) / (-dzl[blockd]);
        } else {
            double buffer;
            blockd = block_zu;
            buffer = mufull / (xu[blockd] + maxp*dxu[blockd]);
            alphad = (zu[blockd]-buffer) / (-dzu[blockd]);
        }
        alphad = std::max(alphad, gammaf*maxd);
        alphad = std::min(alphad, 1.0);
        assert(blockd >= 0.0);
    }
    step_primal_ = std::min(alphap, 1.0-1e-6);
    step_dual_   = std::min(alphad, 1.0-1e-6);

    if (isCentring){
        // When computing stepsizes for a centring step, reduce them
        // by centringAlphaScaling. This ensures that the point is 
        // well centred and does not get too close to the boundary.
        step_primal_ = alphap * control_.centringAlphaScaling();
        step_dual_ = alphad * control_.centringAlphaScaling();
    }
}